

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O2

APInt __thiscall llvm::APIntOps::RoundDoubleToAPInt(APIntOps *this,double Double,uint width)

{
  undefined8 extraout_RDX;
  uint64_t uVar1;
  undefined8 extraout_RDX_00;
  undefined8 uVar2;
  APInt *this_00;
  uint uVar3;
  APInt AVar4;
  APInt Tmp;
  APInt local_50;
  APInt local_40;
  APInt local_30;
  
  uVar3 = (uint)((ulong)Double >> 0x34) & 0x7ff;
  if ((ulong)uVar3 < 0x3ff) {
LAB_0018331a:
    uVar1 = 0;
  }
  else {
    uVar1 = ((ulong)Double & 0xfffffffffffff) + 0x10000000000000;
    if (0x432 < uVar3) {
      if ((ulong)uVar3 - 0x433 < (ulong)width) {
        APInt::APInt(&local_50,width,uVar1,false);
        APInt::operator<<=(&local_50,uVar3 - 0x433);
        if ((long)Double < 0) {
          APInt::APInt(&local_40,&local_50);
          operator-((llvm *)this,&local_40);
          APInt::~APInt(&local_40);
        }
        else {
          APInt::APInt((APInt *)this,&local_50);
        }
        this_00 = &local_50;
        goto LAB_001833e9;
      }
      goto LAB_0018331a;
    }
    uVar1 = uVar1 >> (0x33U - (char)uVar3 & 0x3f);
    if ((long)Double < 0) {
      this_00 = &local_30;
      APInt::APInt(this_00,width,uVar1,false);
      operator-((llvm *)this,this_00);
LAB_001833e9:
      APInt::~APInt(this_00);
      uVar2 = extraout_RDX_00;
      goto LAB_001833ee;
    }
  }
  APInt::APInt((APInt *)this,width,uVar1,false);
  uVar2 = extraout_RDX;
LAB_001833ee:
  AVar4._8_8_ = uVar2;
  AVar4.U.pVal = (uint64_t *)this;
  return AVar4;
}

Assistant:

APInt llvm::APIntOps::RoundDoubleToAPInt(double Double, unsigned width) {
  union {
    double D;
    uint64_t I;
  } T;
  T.D = Double;

  // Get the sign bit from the highest order bit
  bool isNeg = T.I >> 63;

  // Get the 11-bit exponent and adjust for the 1023 bit bias
  int64_t exp = ((T.I >> 52) & 0x7ff) - 1023;

  // If the exponent is negative, the value is < 0 so just return 0.
  if (exp < 0)
    return APInt(width, 0u);

  // Extract the mantissa by clearing the top 12 bits (sign + exponent).
  uint64_t mantissa = (T.I & (~0ULL >> 12)) | 1ULL << 52;

  // If the exponent doesn't shift all bits out of the mantissa
  if (exp < 52)
    return isNeg ? -APInt(width, mantissa >> (52 - exp)) :
                    APInt(width, mantissa >> (52 - exp));

  // If the client didn't provide enough bits for us to shift the mantissa into
  // then the result is undefined, just return 0
  if (width <= exp - 52)
    return APInt(width, 0);

  // Otherwise, we have to shift the mantissa bits up to the right location
  APInt Tmp(width, mantissa);
  Tmp <<= (unsigned)exp - 52;
  return isNeg ? -Tmp : Tmp;
}